

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModel::setFilterCaseSensitivity(QSortFilterProxyModel *this,CaseSensitivity cs)

{
  long lVar1;
  parameter_type pVar2;
  QSortFilterProxyModelPrivate *pQVar3;
  QModelIndex *source_parent;
  parameter_type in_ESI;
  long in_FS_OFFSET;
  QFlagsStorage<QSortFilterProxyModel::Direction> in_stack_0000004c;
  QSortFilterProxyModelPrivate *d;
  QRegularExpression re;
  PatternOptions options;
  QScopedPropertyUpdateGroup guard;
  undefined4 in_stack_ffffffffffffff38;
  Direction in_stack_ffffffffffffff3c;
  QRegularExpression *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  QFlagsStorage<QRegularExpression::PatternOption> options_00;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  QFlags<QRegularExpression::PatternOption> *in_stack_ffffffffffffff60;
  parameter_type pVar4;
  undefined4 in_stack_ffffffffffffff8c;
  QSortFilterProxyModelPrivate *in_stack_ffffffffffffff90;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  *in_stack_ffffffffffffffb0;
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
  *in_stack_ffffffffffffffc0;
  
  options_00.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSortFilterProxyModel *)0x878e4f);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
              *)in_stack_ffffffffffffff50);
  QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(in_stack_ffffffffffffff50);
  pVar4 = in_ESI;
  pVar2 = ::QObjectCompatProperty::operator_cast_to_CaseSensitivity
                    ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
                      *)0x878e8f);
  if (pVar4 != pVar2) {
    QScopedPropertyUpdateGroup::QScopedPropertyUpdateGroup((QScopedPropertyUpdateGroup *)0x878eb3);
    source_parent =
         (QModelIndex *)
         QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
         ::value((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                  *)in_stack_ffffffffffffff40);
    QRegularExpression::patternOptions(in_stack_ffffffffffffff40);
    QFlags<QRegularExpression::PatternOption>::setFlag
              (in_stack_ffffffffffffff60,(PatternOption)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
    QPropertyData<Qt::CaseSensitivity>::setValueBypassingBindings
              (&(pQVar3->filter_casesensitive).super_QPropertyData<Qt::CaseSensitivity>,in_ESI);
    QModelIndex::QModelIndex((QModelIndex *)0x878f42);
    QSortFilterProxyModelPrivate::filter_about_to_be_changed
              ((QSortFilterProxyModelPrivate *)CONCAT44(in_stack_ffffffffffffff8c,pVar4),
               source_parent);
    ::QObjectCompatProperty::operator_cast_to_QRegularExpression_
              ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
                *)0x878f76);
    QRegularExpression::QRegularExpression
              (in_stack_ffffffffffffff40,
               (QRegularExpression *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QRegularExpression::setPatternOptions
              ((QRegularExpression *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (PatternOptions)options_00.i);
    QPropertyData<QRegularExpression>::setValueBypassingBindings
              ((QPropertyData<QRegularExpression> *)in_stack_ffffffffffffff40,
               (parameter_type)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QFlags<QSortFilterProxyModel::Direction>::QFlags
              ((QFlags<QSortFilterProxyModel::Direction> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff3c);
    QModelIndex::QModelIndex((QModelIndex *)0x878ffb);
    QSortFilterProxyModelPrivate::filter_changed
              (in_stack_ffffffffffffff90,(Directions)in_stack_0000004c.i,
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff8c,pVar4));
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_QRegularExpression,_&QSortFilterProxyModelPrivate::_qt_property_filter_regularexpression_offset,_&QSortFilterProxyModelPrivate::setFilterRegularExpressionForwarder,_nullptr,_nullptr>
    ::notify(in_stack_ffffffffffffffb0);
    QObjectCompatProperty<QSortFilterProxyModelPrivate,_Qt::CaseSensitivity,_&QSortFilterProxyModelPrivate::_qt_property_filter_casesensitive_offset,_&QSortFilterProxyModelPrivate::setFilterCaseSensitivityForwarder,_&QSortFilterProxyModelPrivate::filterCaseSensitivityChangedForwarder,_nullptr>
    ::notify(in_stack_ffffffffffffffc0);
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x879046);
    QScopedPropertyUpdateGroup::~QScopedPropertyUpdateGroup((QScopedPropertyUpdateGroup *)0x879053);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModel::setFilterCaseSensitivity(Qt::CaseSensitivity cs)
{
    Q_D(QSortFilterProxyModel);
    d->filter_casesensitive.removeBindingUnlessInWrapper();
    d->filter_regularexpression.removeBindingUnlessInWrapper();
    if (cs == d->filter_casesensitive)
        return;

    const QScopedPropertyUpdateGroup guard;
    QRegularExpression::PatternOptions options =
            d->filter_regularexpression.value().patternOptions();
    options.setFlag(QRegularExpression::CaseInsensitiveOption, cs == Qt::CaseInsensitive);
    d->filter_casesensitive.setValueBypassingBindings(cs);

    d->filter_about_to_be_changed();
    QRegularExpression re = d->filter_regularexpression;
    re.setPatternOptions(options);
    d->filter_regularexpression.setValueBypassingBindings(re);
    d->filter_changed(Direction::Rows);
    d->filter_regularexpression.notify();
    d->filter_casesensitive.notify();
}